

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

MapIterator * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MapBegin
          (MapIterator *__return_storage_ptr__,GeneratedMessageReflection *this,Message *message,
          FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *pMVar2;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  MapIterator *iter;
  
  bVar1 = anon_unknown_0::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MapBegin\"","Field is not a map field.");
  }
  MapIterator::MapIterator(__return_storage_ptr__,message,field);
  pMVar2 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  (*pMVar2->_vptr_MapFieldBase[6])(pMVar2,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

MapIterator GeneratedMessageReflection::MapBegin(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK(IsMapFieldInApi(field),
              "MapBegin",
              "Field is not a map field.");
  MapIterator iter(message, field);
  GetRaw<MapFieldBase>(*message, field).MapBegin(&iter);
  return iter;
}